

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

wchar_t * archive_entry_copy_fflags_text_w(archive_entry *entry,wchar_t *flags)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  
  archive_mstring_copy_wcs(&entry->ae_fflags_text,flags);
  do {
    wVar1 = *flags;
    if (wVar1 < L' ') {
      if (wVar1 != L'\t') {
        if (wVar1 == L'\0') {
          pwVar2 = (wchar_t *)0x0;
          goto LAB_00114332;
        }
LAB_001142e6:
        pwVar2 = (wchar_t *)0x0;
        pwVar3 = flags;
        do {
          while ((0x2c < (ulong)(uint)*flags ||
                 ((0x100100000201U >> ((ulong)(uint)*flags & 0x3f) & 1) == 0))) {
            flags = flags + 1;
          }
          while( true ) {
            wVar1 = *flags;
            if ((0x2c < (ulong)(uint)wVar1) ||
               ((0x100100000200U >> ((ulong)(uint)wVar1 & 0x3f) & 1) == 0)) break;
            flags = flags + 1;
          }
          if (pwVar2 == (wchar_t *)0x0) {
            pwVar2 = pwVar3;
          }
          pwVar3 = flags;
        } while (wVar1 != L'\0');
LAB_00114332:
        entry->ae_fflags_set = 0;
        entry->ae_fflags_clear = 0;
        return pwVar2;
      }
    }
    else if ((wVar1 != L' ') && (wVar1 != L',')) goto LAB_001142e6;
    flags = flags + 1;
  } while( true );
}

Assistant:

const wchar_t *
archive_entry_copy_fflags_text_w(struct archive_entry *entry,
    const wchar_t *flags)
{
	archive_mstring_copy_wcs(&entry->ae_fflags_text, flags);
	return (ae_wcstofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}